

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserAdams.cpp
# Opt level: O1

shared_ptr<chrono::ChLink> __thiscall
chrono::utils::ChParserAdams::Report::GetJoint(Report *this,string *name)

{
  const_iterator cVar1;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<chrono::ChLink> sVar3;
  
  (this->bodies)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->bodies)._M_h._M_bucket_count = 0;
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserAdams::Report::JointInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserAdams::Report::JointInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserAdams::Report::JointInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserAdams::Report::JointInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(name[1].field_2._M_local_buf + 8),in_RDX);
  _Var2._M_pi = extraout_RDX;
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserAdams::Report::JointInfo>,_true>
      ._M_cur != (__node_type *)0x0) {
    (this->bodies)._M_h._M_buckets =
         *(__buckets_ptr *)
          ((long)cVar1.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserAdams::Report::JointInfo>,_true>
                 ._M_cur + 0x48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->bodies)._M_h._M_bucket_count,
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::ChParserAdams::Report::JointInfo>,_true>
                      ._M_cur + 0x50));
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<chrono::ChLink>)
         sVar3.super___shared_ptr<chrono::ChLink,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChLink> ChParserAdams::Report::GetJoint(const std::string& name) const {
    std::shared_ptr<ChLink> joint;
    auto joint_info = joints.find(name);
    if (joint_info != joints.end()) {
        joint = joint_info->second.joint;
    }
    return joint;
}